

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void cortex_m4_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),5);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),9);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x26);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x22);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fc240;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x3184) = 8;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x63a) = 0x10110021;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31d4) = 0x11000011;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x63b) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x30;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x649) = 0x200;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 0x100000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31bc) = 0x30;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x638) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31c4) = 0;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x639) = 0;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x634) = 0x1141110;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31a4) = 0x2111000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x635) = 0x21112231;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31ac) = 0x1111110;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x636) = 0x1310102;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31b4) = 0;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x637) = 0;
  return;
}

Assistant:

static void cortex_m4_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V7);
    set_feature(&cpu->env, ARM_FEATURE_M);
    set_feature(&cpu->env, ARM_FEATURE_M_MAIN);
    set_feature(&cpu->env, ARM_FEATURE_THUMB_DSP);
    cpu->midr = 0x410fc240; /* r0p0 */
    cpu->pmsav7_dregion = 8;
    cpu->isar.mvfr0 = 0x10110021;
    cpu->isar.mvfr1 = 0x11000011;
    cpu->isar.mvfr2 = 0x00000000;
    cpu->id_pfr0 = 0x00000030;
    cpu->id_pfr1 = 0x00000200;
    cpu->isar.id_dfr0 = 0x00100000;
    cpu->id_afr0 = 0x00000000;
    cpu->isar.id_mmfr0 = 0x00000030;
    cpu->isar.id_mmfr1 = 0x00000000;
    cpu->isar.id_mmfr2 = 0x00000000;
    cpu->isar.id_mmfr3 = 0x00000000;
    cpu->isar.id_isar0 = 0x01141110;
    cpu->isar.id_isar1 = 0x02111000;
    cpu->isar.id_isar2 = 0x21112231;
    cpu->isar.id_isar3 = 0x01111110;
    cpu->isar.id_isar4 = 0x01310102;
    cpu->isar.id_isar5 = 0x00000000;
    cpu->isar.id_isar6 = 0x00000000;
}